

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O0

int stackinuse(lua_State *L)

{
  StkId local_20;
  StkId lim;
  CallInfo *ci;
  lua_State *L_local;
  
  local_20 = L->top;
  for (lim = (StkId)L->ci; lim != (StkId)0x0; lim = (StkId)lim[1].value_.gc) {
    if (local_20 < *(StkId *)&lim->tt_) {
      local_20 = *(StkId *)&lim->tt_;
    }
  }
  return (int)((long)local_20 - (long)L->stack >> 4) + 1;
}

Assistant:

static int stackinuse (lua_State *L) {
  CallInfo *ci;
  StkId lim = L->top;
  for (ci = L->ci; ci != NULL; ci = ci->previous) {
    if (lim < ci->top) lim = ci->top;
  }
  lua_assert(lim <= L->stack_last);
  return cast_int(lim - L->stack) + 1;  /* part of stack in use */
}